

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

ExprNode * __thiscall Canonicalizer::visit(Canonicalizer *this,MEM *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ESEQ *this_00;
  long *plVar2;
  StmNode *s;
  MEM *this_01;
  long *plVar3;
  ExprNode *pEVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar1 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
    iVar1 = StmNode::getTypeStm((StmNode *)CONCAT44(extraout_var_00,iVar1));
    if (iVar1 == 7) {
      this->changed = true;
      iVar1 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
      plVar3 = (long *)CONCAT44(extraout_var_01,iVar1);
      this_00 = (ESEQ *)operator_new(0x20);
      plVar2 = (long *)(**(code **)(*plVar3 + 0x20))(plVar3);
      s = (StmNode *)(**(code **)(*plVar2 + 0x18))(plVar2,this);
      this_01 = (MEM *)operator_new(0x18);
      plVar3 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
      pEVar4 = (ExprNode *)(**(code **)(*plVar3 + 0x18))(plVar3,this);
      MEM::MEM(this_01,pEVar4);
      ESEQ::ESEQ(this_00,s,(ExprNode *)this_01);
      return &this_00->super_ExprNode;
    }
  }
  iVar1 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
  if (CONCAT44(extraout_var_02,iVar1) != 0) {
    iVar1 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
    pEVar4 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_03,iVar1),this);
    MEM::setE(node,pEVar4);
  }
  return &node->super_ExprNode;
}

Assistant:

ExprNode *Canonicalizer::visit(MEM *node) {
    if (node->getE() && node->getE()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getE();
        return new ESEQ(eseq->getS()->accept(this),
                        new MEM(eseq->getE()->accept(this)));
    } else {
        if (node->getE()) node->setE(node->getE()->accept(this));
    }
    return node;
}